

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void * asio::detail::thread_info_base::
       allocate<asio::detail::thread_info_base::executor_function_tag>
                 (long param_1,byte *param_2,ulong param_3)

{
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  void *pointer_1;
  void *pvVar4;
  long lVar5;
  byte *pbVar6;
  void *pointer;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  
  pbVar1 = param_2 + 3;
  if (param_1 != 0) {
    uVar7 = 4;
    bVar9 = false;
    pbVar6 = param_2;
    do {
      pbVar2 = *(byte **)(param_1 + uVar7 * 8);
      if (pbVar2 != (byte *)0x0) {
        bVar3 = true;
        if (((ulong)pbVar1 >> 2 <= (ulong)*pbVar2) && ((ulong)pbVar2 % param_3 == 0)) {
          *(undefined8 *)(param_1 + uVar7 * 8) = 0;
          pbVar2[(long)param_2] = *pbVar2;
          bVar3 = false;
          pbVar6 = pbVar2;
        }
        if (!bVar3) break;
      }
      bVar9 = 4 < uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 6);
    if (!bVar9) {
      return pbVar6;
    }
    lVar5 = 0;
    do {
      pvVar4 = *(void **)(param_1 + 0x20 + lVar5 * 8);
      if (pvVar4 != (void *)0x0) {
        *(undefined8 *)(param_1 + 0x20 + lVar5 * 8) = 0;
        operator_delete(pvVar4);
        break;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  pvVar4 = operator_new(((ulong)pbVar1 & 0xfffffffffffffffc) + 1);
  bVar8 = (byte)((ulong)pbVar1 >> 2);
  if ((byte *)0x3ff < pbVar1) {
    bVar8 = 0;
  }
  *(byte *)((long)pvVar4 + (long)param_2) = bVar8;
  return pvVar4;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }